

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_SubDEdgePtr>::Prepend
          (ON_SimpleArray<ON_SubDEdgePtr> *this,int count,ON_SubDEdgePtr *buffer)

{
  ON_SubDEdgePtr *pOVar1;
  size_t sz;
  int iVar2;
  ON_SubDEdgePtr *__dest;
  ON_SubDEdgePtr *__dest_00;
  long lVar3;
  ON_SubDEdgePtr *pOVar4;
  ON_SubDEdgePtr *pOVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  if (buffer != (ON_SubDEdgePtr *)0x0 && 0 < count) {
    sz = (ulong)(uint)count * 8;
    iVar2 = this->m_count;
    uVar8 = count + iVar2;
    if (this->m_capacity < (int)uVar8) {
      if (iVar2 < 8 || (ulong)((long)iVar2 * 8) < 0x10000001) {
        uVar7 = 4;
        if (2 < iVar2) {
          uVar7 = iVar2 * 2;
        }
      }
      else {
        iVar6 = 0x2000008;
        if (iVar2 < 0x2000008) {
          iVar6 = iVar2;
        }
        uVar7 = iVar6 + iVar2;
      }
      if ((int)uVar8 < (int)uVar7) {
        uVar8 = uVar7;
      }
      if (buffer < this->m_a + this->m_capacity && this->m_a <= buffer) {
        __dest_00 = (ON_SubDEdgePtr *)onmalloc(sz);
        memcpy(__dest_00,buffer,sz);
        buffer = __dest_00;
      }
      else {
        __dest_00 = (ON_SubDEdgePtr *)0x0;
      }
      if ((uint)this->m_capacity < uVar8) {
        SetCapacity(this,(long)(int)uVar8);
      }
    }
    else {
      __dest_00 = (ON_SubDEdgePtr *)0x0;
    }
    lVar3 = (long)this->m_count;
    lVar9 = (ulong)(uint)count + lVar3;
    __dest = this->m_a;
    if (0 < lVar3) {
      pOVar4 = __dest + lVar3;
      pOVar5 = __dest + lVar9;
      do {
        pOVar5 = pOVar5 + -1;
        pOVar1 = pOVar4 + -1;
        pOVar4 = pOVar4 + -1;
        pOVar5->m_ptr = pOVar1->m_ptr;
      } while (__dest < pOVar4);
    }
    memcpy(__dest,buffer,sz);
    if (__dest_00 != (ON_SubDEdgePtr *)0x0) {
      onfree(__dest_00);
    }
    this->m_count = (int)lVar9;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Prepend( int count, const T* buffer ) 
{
  if ( count > 0 && nullptr != buffer ) 
  {
    const size_t sizeof_buffer = count * sizeof(T);
    void* temp = nullptr;
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      if ( buffer >= m_a && buffer < (m_a + m_capacity) )
      {
        // buffer is in the block of memory about to be reallocated
        temp = onmalloc(sizeof_buffer);
        memcpy(temp, buffer, sizeof_buffer);
        buffer = (const T*)temp;
      }
      Reserve( newcapacity );
    }

    const size_t count0 = (size_t)m_count;
    const size_t count1 = count0 + ((size_t)count);
    T* p0 = m_a;
    T* p = p0 + count0;
    T* p1 = m_a + count1;
    while (p > p0)
      *(--p1) = *(--p);
    memcpy( (void*)(m_a), (void*)(buffer), sizeof_buffer );
    if (nullptr != temp)
      onfree(temp);
    m_count = (int)count1;
  }
}